

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SetEnumValueInternal
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  bool bVar1;
  undefined4 in_ECX;
  FieldDescriptor *in_RDX;
  Reflection *in_RSI;
  int *in_RDI;
  FieldDescriptor *in_stack_000000c8;
  int in_stack_000000d4;
  FieldType in_stack_000000db;
  int in_stack_000000dc;
  ExtensionSet *in_stack_000000e0;
  Message *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  
  bVar1 = FieldDescriptor::is_extension(in_RDX);
  if (bVar1) {
    MutableExtensionSet((Reflection *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
    FieldDescriptor::number(in_RDX);
    FieldDescriptor::type((FieldDescriptor *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
    internal::ExtensionSet::SetEnum
              (in_stack_000000e0,in_stack_000000dc,in_stack_000000db,in_stack_000000d4,
               in_stack_000000c8);
  }
  else {
    SetField<int>(in_RSI,(Message *)in_RDX,
                  (FieldDescriptor *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_RDI);
  }
  return;
}

Assistant:

void Reflection::SetEnumValueInternal(Message* message,
                                      const FieldDescriptor* field,
                                      int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetEnum(field->number(), field->type(), value,
                                          field);
  } else {
    SetField<int>(message, field, value);
  }
}